

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator^(long u,sc_unsigned *v)

{
  small_type nd;
  long in_RDX;
  sc_signed *in_RSI;
  sc_signed *in_RDI;
  small_type in_stack_00000014;
  sc_digit *in_stack_00000018;
  int in_stack_00000024;
  int in_stack_00000028;
  small_type in_stack_0000002c;
  sc_digit ud [3];
  small_type us;
  sc_digit *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  sc_digit *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  sc_digit *in_stack_ffffffffffffffd8;
  
  if (in_RSI == (sc_signed *)0x0) {
    sc_signed::sc_signed(in_RDI,(sc_unsigned *)in_RDI);
  }
  else {
    nd = get_sign<long>((long *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    from_uint<unsigned_long>
              (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (*(int *)(in_RDX + 8) == 0) {
      sc_signed::sc_signed
                (in_RSI,(small_type)((ulong)in_RDX >> 0x20),(int)in_RDX,nd,in_stack_ffffffffffffffd8
                 ,SUB81((ulong)in_RDI >> 0x38,0));
    }
    else {
      xor_signed_friend(in_stack_0000002c,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                        in_stack_00000014,(int)v,(int)u,in_stack_00000050);
    }
  }
  return in_RDI;
}

Assistant:

sc_signed
operator^(long u, const sc_unsigned& v)
{

  if (u == 0)
    return sc_signed(v);

  CONVERT_LONG(u);

  if (v.sgn == SC_ZERO)
    return sc_signed(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud, false);

  // other cases
  return xor_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}